

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall
crnd::crn_unpacker::unpack_etc1
          (crn_unpacker *this,uint8 **pDst,uint32 output_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  uint32 uVar4;
  uint uVar5;
  uint32 uVar6;
  uint uVar7;
  block_buffer_element *pbVar8;
  uint *puVar9;
  uint8 (*pauVar10) [4];
  byte local_ac;
  uint local_a8;
  bool local_9d;
  uint local_8c;
  uint local_88;
  uint c_1;
  uint c;
  uint32 diff;
  uint32 flip;
  uint32 selector_index;
  char cStack_6e;
  uint8 e1 [4];
  uint8 e0 [4];
  uint8 block_endpoint [4];
  uint8 endpoint_reference;
  block_buffer_element *buffer;
  uint32 x;
  bool visible;
  uint8 (*pauStack_50) [4];
  uint32 y;
  uint32 *pData;
  uint32 f;
  uint uStack_38;
  uint8 reference_group;
  uint32 diagonal_color_endpoint_index;
  uint32 color_endpoint_index;
  int32 delta_pitch_in_dwords;
  uint32 height;
  uint32 width;
  uint32 num_color_endpoints;
  uint32 output_height_local;
  uint32 output_width_local;
  uint32 output_pitch_in_bytes_local;
  uint8 **pDst_local;
  crn_unpacker *this_local;
  
  uVar2 = vector<unsigned_int>::size(&this->m_color_endpoints);
  uVar3 = output_width + 1 & 0xfffffffe;
  uVar4 = vector<crnd::crn_unpacker::block_buffer_element>::size(&this->m_block_buffer);
  if (uVar4 < uVar3 << 1) {
    vector<crnd::crn_unpacker::block_buffer_element>::resize(&this->m_block_buffer,uVar3 << 1);
  }
  uStack_38 = 0;
  f = 0;
  for (pData._4_4_ = 0;
      uVar5 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&this->m_pHeader->m_faces), pData._4_4_ < uVar5;
      pData._4_4_ = pData._4_4_ + 1) {
    pauStack_50 = (uint8 (*) [4])pDst[pData._4_4_];
    for (x = 0; x < (output_height + 1 & 0xfffffffe); x = x + 1) {
      bVar1 = x < output_height;
      for (buffer._4_4_ = 0; buffer._4_4_ < uVar3; buffer._4_4_ = buffer._4_4_ + 1) {
        local_9d = bVar1 && buffer._4_4_ < output_width;
        pbVar8 = vector<crnd::crn_unpacker::block_buffer_element>::operator[]
                           (&this->m_block_buffer,buffer._4_4_ << 1);
        if ((x & 1) == 0) {
          uVar4 = symbol_codec::decode(&this->m_codec,&this->m_reference_encoding_dm);
          e0[0] = (byte)uVar4 & 3 | (byte)((int)(uVar4 & 0xff) >> 2) & 0xc;
          pbVar8->endpoint_reference =
               (ushort)((int)(uVar4 & 0xff) >> 2) & 3 | (ushort)((int)(uVar4 & 0xff) >> 4) & 0xc;
        }
        else {
          e0[0] = (uint8)pbVar8->endpoint_reference;
        }
        if ((e0[0] & 3) == 0) {
          uVar4 = symbol_codec::decode(&this->m_codec,this->m_endpoint_delta_dm);
          uStack_38 = uVar4 + uStack_38;
          if (uVar2 <= uStack_38) {
            uStack_38 = uStack_38 - uVar2;
          }
          pbVar8->color_endpoint_index = (uint16)uStack_38;
        }
        else if ((e0[0] & 3) == 1) {
          pbVar8->color_endpoint_index = (uint16)uStack_38;
        }
        else if ((e0[0] & 3) == 3) {
          uStack_38 = f;
          pbVar8->color_endpoint_index = (uint16)f;
        }
        else {
          uStack_38 = (uint)pbVar8->color_endpoint_index;
        }
        puVar9 = vector<unsigned_int>::operator[](&this->m_color_endpoints,uStack_38);
        unique0x00011f80 = *puVar9;
        uVar4 = symbol_codec::decode(&this->m_codec,this->m_selector_delta_dm);
        if ((char)((int)(uint)e0[0] >> 2) != '\0') {
          uVar6 = symbol_codec::decode(&this->m_codec,this->m_endpoint_delta_dm);
          uStack_38 = uVar6 + uStack_38;
          if (uVar2 <= uStack_38) {
            uStack_38 = uStack_38 - uVar2;
          }
        }
        pbVar8 = vector<crnd::crn_unpacker::block_buffer_element>::operator[]
                           (&this->m_block_buffer,buffer._4_4_ << 1 | 1);
        f = (uint32)pbVar8->color_endpoint_index;
        pbVar8 = vector<crnd::crn_unpacker::block_buffer_element>::operator[]
                           (&this->m_block_buffer,buffer._4_4_ << 1 | 1);
        pbVar8->color_endpoint_index = (uint16)uStack_38;
        puVar9 = vector<unsigned_int>::operator[](&this->m_color_endpoints,uStack_38);
        unique0x00011f80 = *puVar9;
        uVar5 = stack0xffffffffffffff8b;
        if (bVar1 && buffer._4_4_ < output_width) {
          uVar7 = (int)(uint)e0[0] >> 3 ^ 1;
          local_88 = 0;
          c_1 = 1;
          while (c_1 != 0 && local_88 < 3) {
            if ((*(byte *)((long)&selector_index + (ulong)local_88 + 3) + 3 <
                 (uint)*(byte *)((long)&flip + (ulong)local_88 + 3)) ||
               (*(byte *)((long)&flip + (ulong)local_88 + 3) + 4 <
                (uint)*(byte *)((long)&selector_index + (ulong)local_88 + 3))) {
              local_a8 = 0;
            }
            else {
              local_a8 = c_1;
            }
            local_88 = local_88 + 1;
            c_1 = local_a8;
          }
          for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
            if (c_1 == 0) {
              local_ac = (*(byte *)((long)&selector_index + (ulong)local_8c + 3) & 0x1e) << 3 |
                         (byte)((int)(uint)*(byte *)((long)&flip + (ulong)local_8c + 3) >> 1);
            }
            else {
              local_ac = *(char *)((long)&selector_index + (ulong)local_8c + 3) << 3 |
                         *(char *)((long)&flip + (ulong)local_8c + 3) -
                         *(char *)((long)&selector_index + (ulong)local_8c + 3) & 7U;
            }
            e1[local_8c] = local_ac;
          }
          selector_index._2_1_ = (char)(unique0x00011f80 >> 0x18);
          e1[3] = cStack_6e << 5 | selector_index._2_1_ << 2 | (byte)(c_1 << 1) | (byte)uVar7;
          *pauStack_50 = e1;
          unique0x100003de = uVar5;
          pauVar10 = (uint8 (*) [4])
                     vector<unsigned_int>::operator[](&this->m_color_selectors,uVar4 << 1 | uVar7);
          pauStack_50[1] = *pauVar10;
        }
        pauStack_50 = pauStack_50 + 2;
        bVar1 = local_9d;
      }
      pauStack_50 = pauStack_50 + (int)((output_pitch_in_bytes >> 2) + uVar3 * -2);
    }
  }
  return true;
}

Assistant:

bool unpack_etc1(uint8** pDst, uint32 output_pitch_in_bytes, uint32 output_width, uint32 output_height)
        {
            const uint32 num_color_endpoints = m_color_endpoints.size();
            const uint32 width = (output_width + 1) & ~1;
            const uint32 height = (output_height + 1) & ~1;
            const int32 delta_pitch_in_dwords = (output_pitch_in_bytes >> 2) - (width << 1);

            if (m_block_buffer.size() < width << 1)
                m_block_buffer.resize(width << 1);

            uint32 color_endpoint_index = 0, diagonal_color_endpoint_index = 0;
            uint8 reference_group = 0;

            for (uint32 f = 0; f < m_pHeader->m_faces; f++)
            {
                uint32* pData = (uint32*)pDst[f];
                for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords)
                {
                    bool visible = y < output_height;
                    for (uint32 x = 0; x < width; x++, pData += 2)
                    {
                        visible = visible && x < output_width;
                        block_buffer_element& buffer = m_block_buffer[x << 1];
                        uint8 endpoint_reference, block_endpoint[4], e0[4], e1[4];
                        if (y & 1)
                        {
                            endpoint_reference = buffer.endpoint_reference;
                        }
                        else
                        {
                            reference_group = m_codec.decode(m_reference_encoding_dm);
                            endpoint_reference = (reference_group & 3) | (reference_group >> 2 & 12);
                            buffer.endpoint_reference = (reference_group >> 2 & 3) | (reference_group >> 4 & 12);
                        }
                        if (!(endpoint_reference & 3))
                        {
                            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
                            if (color_endpoint_index >= num_color_endpoints)
                                color_endpoint_index -= num_color_endpoints;
                            buffer.color_endpoint_index = color_endpoint_index;
                        }
                        else if ((endpoint_reference & 3) == 1)
                        {
                            buffer.color_endpoint_index = color_endpoint_index;
                        }
                        else if ((endpoint_reference & 3) == 3)
                        {
                            buffer.color_endpoint_index = color_endpoint_index = diagonal_color_endpoint_index;
                        }
                        else
                        {
                            color_endpoint_index = buffer.color_endpoint_index;
                        }
                        endpoint_reference >>= 2;
                        *(uint32*)&e0 = m_color_endpoints[color_endpoint_index];
                        uint32 selector_index = m_codec.decode(m_selector_delta_dm[0]);
                        if (endpoint_reference)
                        {
                            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
                            if (color_endpoint_index >= num_color_endpoints)
                                color_endpoint_index -= num_color_endpoints;
                        }
                        diagonal_color_endpoint_index = m_block_buffer[x << 1 | 1].color_endpoint_index;
                        m_block_buffer[x << 1 | 1].color_endpoint_index = color_endpoint_index;
                        *(uint32*)&e1 = m_color_endpoints[color_endpoint_index];
                        if (visible)
                        {
                            uint32 flip = endpoint_reference >> 1 ^ 1, diff = 1;
                            for (uint c = 0; diff && c < 3; c++)
                                diff = e0[c] + 3 >= e1[c] && e1[c] + 4 >= e0[c] ? diff : 0;
                            for (uint c = 0; c < 3; c++)
                                block_endpoint[c] = diff ? e0[c] << 3 | ((e1[c] - e0[c]) & 7) : (e0[c] << 3 & 0xF0) | e1[c] >> 1;
                            block_endpoint[3] = e0[3] << 5 | e1[3] << 2 | diff << 1 | flip;
                            pData[0] = *(uint32*)&block_endpoint;
                            pData[1] = m_color_selectors[selector_index << 1 | flip];
                        }
                    }
                }
            }
            return true;
        }